

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_newton.c
# Opt level: O1

int SUNNonlinSolSolve_Newton
              (SUNNonlinearSolver NLS,N_Vector y0,N_Vector y,N_Vector w,realtype tol,int callLSetup,
              void *mem)

{
  long *plVar1;
  N_Vector x;
  undefined8 *puVar2;
  void *pvVar3;
  int iVar4;
  undefined8 uVar5;
  bool bVar6;
  
  iVar4 = -1;
  if (mem != (void *)0x0 &&
      ((w != (N_Vector)0x0 && y != (N_Vector)0x0) &&
      (y0 != (N_Vector)0x0 && NLS != (SUNNonlinearSolver)0x0))) {
    x = *(N_Vector *)((long)NLS->content + 0x20);
    iVar4 = (**NLS->content)(y0,x,mem);
    if (iVar4 == 0) {
      bVar6 = callLSetup == 0;
      uVar5 = 0;
      while ((bVar6 || (iVar4 = (**(code **)((long)NLS->content + 8))
                                          (y0,x,uVar5,(long)NLS->content + 0x28,mem), iVar4 == 0)))
      {
        *(undefined4 *)((long)NLS->content + 0x2c) = 0;
        N_VScale(1.0,y0,y);
        do {
          plVar1 = (long *)((long)NLS->content + 0x38);
          *plVar1 = *plVar1 + 1;
          N_VScale(-1.0,x,x);
          iVar4 = (**(code **)((long)NLS->content + 0x10))(y,x,mem);
          if (iVar4 != 0) break;
          N_VLinearSum(1.0,y,1.0,x,y);
          iVar4 = (**(code **)((long)NLS->content + 0x18))(tol,NLS,y,x,w,mem);
          if (iVar4 != 1) {
            if (iVar4 == 0) {
              *(undefined4 *)((long)NLS->content + 0x28) = 0;
              return 0;
            }
            break;
          }
          puVar2 = (undefined8 *)NLS->content;
          iVar4 = *(int *)((long)puVar2 + 0x2c) + 1;
          *(int *)((long)puVar2 + 0x2c) = iVar4;
          if (*(int *)(puVar2 + 6) <= iVar4) {
            iVar4 = 2;
            break;
          }
          iVar4 = (*(code *)*puVar2)(y,x,mem);
        } while (iVar4 == 0);
        if (((iVar4 < 1) || (pvVar3 = NLS->content, *(int *)((long)pvVar3 + 0x28) != 0)) ||
           (*(long *)((long)pvVar3 + 8) == 0)) break;
        *(long *)((long)pvVar3 + 0x40) = *(long *)((long)pvVar3 + 0x40) + 1;
        iVar4 = (**NLS->content)(y0,x,mem);
        uVar5 = 1;
        bVar6 = false;
        if (iVar4 != 0) break;
      }
    }
    plVar1 = (long *)((long)NLS->content + 0x40);
    *plVar1 = *plVar1 + 1;
  }
  return iVar4;
}

Assistant:

int SUNNonlinSolSolve_Newton(SUNNonlinearSolver NLS,
                             N_Vector y0, N_Vector y,
                             N_Vector w, realtype tol,
                             booleantype callLSetup, void* mem)
{
  /* local variables */
  int retval;
  booleantype jbad;
  N_Vector delta;

  /* check that the inputs are non-null */
  if ( (NLS == NULL) ||
       (y0  == NULL) ||
       (y   == NULL) ||
       (w   == NULL) ||
       (mem == NULL) )
    return(SUN_NLS_MEM_NULL);

  /* set local shortcut variables */
  delta = NEWTON_CONTENT(NLS)->delta;

  /* assume the Jacobian is good */
  jbad = SUNFALSE;

  /* looping point for attempts at solution of the nonlinear system:
       Evaluate the nonlinear residual function (store in delta)
       Setup the linear solver if necessary
       Preform Newton iteraion */
  for(;;) {

    /* compute the nonlinear residual, store in delta */
    retval = NEWTON_CONTENT(NLS)->Sys(y0, delta, mem);
    if (retval != SUN_NLS_SUCCESS) break;

    /* if indicated, setup the linear system */
    if (callLSetup) {
      retval = NEWTON_CONTENT(NLS)->LSetup(y0, delta, jbad,
                                           &(NEWTON_CONTENT(NLS)->jcur),
                                           mem);
      if (retval != SUN_NLS_SUCCESS) break;
    }

    /* initialize counter curiter */
    NEWTON_CONTENT(NLS)->curiter = 0;

    /* load prediction into y */
    N_VScale(ONE, y0, y);

    /* looping point for Newton iteration. Break out on any error. */
    for(;;) {

      /* increment nonlinear solver iteration counter */
      NEWTON_CONTENT(NLS)->niters++;

      /* compute the negative of the residual for the linear system rhs */
      N_VScale(-ONE, delta, delta);

      /* solve the linear system to get Newton update delta */
      retval = NEWTON_CONTENT(NLS)->LSolve(y, delta, mem);
      if (retval != SUN_NLS_SUCCESS) break;

      /* update the Newton iterate */
      N_VLinearSum(ONE, y, ONE, delta, y);

      /* test for convergence */
      retval = NEWTON_CONTENT(NLS)->CTest(NLS, y, delta, tol, w, mem);

      /* if successful update Jacobian status and return */
      if (retval == SUN_NLS_SUCCESS) {
        NEWTON_CONTENT(NLS)->jcur = SUNFALSE;
        return(SUN_NLS_SUCCESS);
      }

      /* check if the iteration should continue; otherwise exit Newton loop */
      if (retval != SUN_NLS_CONTINUE) break;

      /* not yet converged. Increment curiter and test for max allowed. */
      NEWTON_CONTENT(NLS)->curiter++;
      if (NEWTON_CONTENT(NLS)->curiter >= NEWTON_CONTENT(NLS)->maxiters) {
        retval = SUN_NLS_CONV_RECVR;
        break;
      }

      /* compute the nonlinear residual, store in delta */
      retval = NEWTON_CONTENT(NLS)->Sys(y, delta, mem);
      if (retval != SUN_NLS_SUCCESS) break;

    } /* end of Newton iteration loop */

    /* all errors go here */

    /* If there is a recoverable convergence failure and the Jacobian-related
       data appears not to be current, increment the convergence failure count
       and loop again with a call to lsetup in which jbad is TRUE. Otherwise
       break out and return. */
    if ((retval > 0) && !(NEWTON_CONTENT(NLS)->jcur) && (NEWTON_CONTENT(NLS)->LSetup)) {
      NEWTON_CONTENT(NLS)->nconvfails++;
      callLSetup = SUNTRUE;
      jbad = SUNTRUE;
      continue;
    } else {
      break;
    }

  } /* end of setup loop */

  /* increment number of convergence failures */
  NEWTON_CONTENT(NLS)->nconvfails++;

  /* all error returns exit here */
  return(retval);
}